

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t *ts;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char (*ts_1) [2];
  Variant *pVVar3;
  char cVar4;
  bool bVar5;
  char cVar6;
  uint32_t uVar7;
  BaseType BVar8;
  long *plVar9;
  const_iterator cVar10;
  SPIRType *pSVar11;
  SPIRConstant *pSVar12;
  SPIRType *pSVar13;
  CompilerError *this_00;
  runtime_error *this_01;
  uint uVar14;
  size_type *psVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1_00;
  uint *ts_1_01;
  uint uVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  char (*in_R8) [2];
  uint *in_R9;
  uint32_t *ts_00;
  char (*in_stack_ffffffffffffff28) [2];
  string scope_expr;
  string __str;
  char *local_88;
  uint32_t id_local;
  SPIRType *local_78;
  string local_70;
  string local_50;
  
  id_local = id;
  bVar5 = Compiler::is_physical_pointer(&this->super_Compiler,type);
  if ((bVar5) &&
     (bVar5 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,type), !bVar5)) {
    pSVar11 = Compiler::get_pointee_type(&this->super_Compiler,type);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,pSVar11,0);
    local_78 = type;
    uVar7 = Compiler::get_decoration(&this->super_Compiler,(ID)(type->parent_type).id,ArrayStride);
    paVar1 = &scope_expr.field_2;
    do {
      bVar5 = Compiler::is_array(&this->super_Compiler,pSVar11);
      if (!bVar5) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      if ((pSVar11->array_size_literal).super_VectorView<bool>.ptr
          [(pSVar11->array_size_literal).super_VectorView<bool>.buffer_size - 1] == true) {
        ts_1 = (char (*) [2])(local_78->array).super_VectorView<unsigned_int>.buffer_size;
        join<unsigned_int_const&,char_const(&)[2]>
                  (&scope_expr,
                   (spirv_cross *)
                   ((local_78->array).super_VectorView<unsigned_int>.ptr + (long)(ts_1[-1] + 1)),
                   (uint *)0x383d48,ts_1);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)scope_expr._M_dataplus._M_p);
      }
      else {
        join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                  (&scope_expr,(spirv_cross *)0x360410,
                   (char (*) [3])
                   ((local_78->array).super_VectorView<unsigned_int>.ptr +
                   ((local_78->array).super_VectorView<unsigned_int>.buffer_size - 1)),
                   (uint *)0x383d48,in_R8);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)scope_expr._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scope_expr._M_dataplus._M_p != paVar1) {
        operator_delete(scope_expr._M_dataplus._M_p);
      }
      cVar6 = '\x01';
      if (9 < uVar7) {
        uVar17 = (ulong)uVar7;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          uVar14 = (uint)uVar17;
          if (uVar14 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_002fbc49;
          }
          if (uVar14 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_002fbc49;
          }
          if (uVar14 < 10000) goto LAB_002fbc49;
          uVar17 = uVar17 / 10000;
          cVar4 = cVar6 + '\x04';
        } while (99999 < uVar14);
        cVar6 = cVar6 + '\x01';
      }
LAB_002fbc49:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar6);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar7);
      in_R8 = (char (*) [2])0x7;
      plVar9 = (long *)::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3a3e6a);
      psVar15 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar15) {
        scope_expr.field_2._M_allocated_capacity = *psVar15;
        scope_expr.field_2._8_8_ = plVar9[3];
        scope_expr._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        scope_expr.field_2._M_allocated_capacity = *psVar15;
        scope_expr._M_dataplus._M_p = (pointer)*plVar9;
      }
      scope_expr._M_string_length = plVar9[1];
      *plVar9 = (long)psVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)scope_expr._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scope_expr._M_dataplus._M_p != paVar1) {
        operator_delete(scope_expr._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      uVar7 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(pSVar11->parent_type).id,ArrayStride);
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (pSVar11->parent_type).id);
    } while( true );
  }
  BVar8 = type->basetype;
  pSVar11 = type;
  switch(BVar8) {
  case Void:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar19 = "void";
    pcVar18 = "";
    goto LAB_002fbe87;
  default:
switchD_002fbadc_caseD_2:
    if (BVar8 == AtomicCounter) {
      bVar5 = (this->options).es;
      uVar14 = (this->options).version;
      if ((uVar14 < 0x136 & bVar5) == 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"At least ESSL 3.10 required for atomic counters.");
        goto LAB_002fc5ca;
      }
      if (bVar5 == false && uVar14 < 0x1a4) {
        scope_expr._M_dataplus._M_p = (pointer)&scope_expr.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&scope_expr,"GL_ARB_shader_atomic_counters","");
        require_extension_internal(this,&scope_expr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)scope_expr._M_dataplus._M_p != &scope_expr.field_2) {
          operator_delete(scope_expr._M_dataplus._M_p);
        }
      }
    }
LAB_002fbf70:
    while ((bVar5 = Compiler::is_pointer(&this->super_Compiler,pSVar11), bVar5 ||
           (bVar5 = Compiler::is_array(&this->super_Compiler,pSVar11), bVar5))) {
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (pSVar11->parent_type).id);
    }
    if (*(int *)&(pSVar11->super_IVariant).field_0xc == 0x1168) {
      paVar1 = &scope_expr.field_2;
      scope_expr._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&scope_expr,"GL_KHR_cooperative_matrix","");
      require_extension_internal(this,&scope_expr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scope_expr._M_dataplus._M_p != paVar1) {
        operator_delete(scope_expr._M_dataplus._M_p);
      }
      if ((this->options).vulkan_semantics != false) {
        pSVar12 = Variant::get<spirv_cross::SPIRConstant>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + (pSVar11->cooperative).use_id);
        uVar7 = (pSVar12->m).c[0].r[0].u32;
        if (uVar7 == 2) {
          local_88 = "gl_MatrixUseAccumulator";
        }
        else if (uVar7 == 1) {
          local_88 = "gl_MatrixUseB";
        }
        else {
          if (uVar7 != 0) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"Invalid matrix use.");
            goto LAB_002fc5ca;
          }
          local_88 = "gl_MatrixUseA";
        }
        scope_expr._M_string_length = 0;
        scope_expr.field_2._M_allocated_capacity =
             scope_expr.field_2._M_allocated_capacity & 0xffffffffffffff00;
        uVar17 = (ulong)(pSVar11->cooperative).scope_id;
        scope_expr._M_dataplus._M_p = (pointer)paVar1;
        if (((uVar17 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                       buffer_size) &&
            (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
            pVVar3[uVar17].type == TypeConstant)) &&
           (pSVar12 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar17),
           pSVar12->specialization == false)) {
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&__str,"GL_KHR_memory_scope_semantics","");
          require_extension_internal(this,&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          uVar7 = (pSVar12->m).c[0].r[0].u32;
          if (uVar7 == 2) {
            pcVar18 = "gl_ScopeWorkgroup";
          }
          else {
            if (uVar7 != 3) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error(this_01,"Invalid scope for cooperative matrix.");
              *(undefined ***)this_01 = &PTR__runtime_error_0048ff00;
              __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            pcVar18 = "gl_ScopeSubgroup";
          }
          ::std::__cxx11::string::operator=((string *)&scope_expr,pcVar18);
        }
        if (scope_expr._M_string_length == 0) {
          to_expression_abi_cxx11_(&__str,this,(pSVar11->cooperative).scope_id,true);
          ::std::__cxx11::string::operator=((string *)&scope_expr,(string *)&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
        }
        pSVar13 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + (pSVar11->parent_type).id);
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&__str,this,pSVar13,0);
        to_expression_abi_cxx11_(&local_50,this,(pSVar11->cooperative).rows_id,true);
        to_expression_abi_cxx11_(&local_70,this,(pSVar11->cooperative).columns_id,true);
        join<char_const(&)[9],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],char_const*&,char_const(&)[2]>
                  (__return_storage_ptr__,(spirv_cross *)"coopmat<",(char (*) [9])&__str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x394b62,
                   (char (*) [3])&scope_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x394b62,
                   (char (*) [3])&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x394b62,
                   (char (*) [3])&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x394b62,
                   (char (*) [3])&local_88,(char **)0x395c2f,in_stack_ffffffffffffff28);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)scope_expr._M_dataplus._M_p == paVar1) {
          return __return_storage_ptr__;
        }
LAB_002fc34d:
        operator_delete(scope_expr._M_dataplus._M_p);
        return __return_storage_ptr__;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Cooperative matrix only available in Vulkan.");
LAB_002fc5ca:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar14 = type->vecsize;
    uVar2 = type->columns;
    if (uVar2 != 1 || uVar14 != 1) {
      ts = &type->vecsize;
      if (uVar14 < 2 || uVar2 != 1) {
        uVar16 = type->basetype - Boolean;
        uVar17 = (ulong)uVar16;
        if (uVar14 == uVar2) {
          if (uVar16 < 0xd) {
            ts_1_01 = (uint *)((long)&switchD_002fc1be::switchdataD_0039a02c +
                              (long)(int)(&switchD_002fc1be::switchdataD_0039a02c)[uVar17]);
            switch(uVar17) {
            case 0:
              pcVar18 = "bmat";
              break;
            default:
              goto switchD_002fc077_default;
            case 5:
              pcVar18 = "imat";
              break;
            case 6:
              pcVar18 = "umat";
              break;
            case 10:
              pcVar18 = "f16mat";
              goto LAB_002fc50f;
            case 0xb:
              pcVar18 = "f16mat";
              goto LAB_002fc544;
            case 0xc:
              pcVar18 = "dmat";
            }
            goto LAB_002fc4da;
          }
        }
        else if (uVar16 < 0xd) {
          ts_00 = &type->columns;
          switch(uVar17) {
          case 0:
            pcVar18 = "bmat";
            break;
          default:
            goto switchD_002fc077_default;
          case 5:
            pcVar18 = "imat";
            break;
          case 6:
            pcVar18 = "umat";
            break;
          case 10:
            join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"f16mat",(char (*) [7])ts_00,
                       (uint *)0x397f89,(char (*) [2])ts,in_R9);
            return __return_storage_ptr__;
          case 0xb:
            join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)0x3a4039,(char (*) [4])ts_00,
                       (uint *)0x397f89,(char (*) [2])ts,in_R9);
            return __return_storage_ptr__;
          case 0xc:
            pcVar18 = "dmat";
          }
          join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)pcVar18,(char (*) [5])ts_00,
                     (uint *)0x397f89,(char (*) [2])ts,in_R9);
          return __return_storage_ptr__;
        }
switchD_002fc077_default:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar19 = "???";
        pcVar18 = "";
        goto LAB_002fbe87;
      }
      ts_1_01 = &switchD_002fc0d0::switchdataD_0039a060;
      switch(type->basetype) {
      case Boolean:
        pcVar18 = "bvec";
        goto LAB_002fc4da;
      case SByte:
        pcVar18 = "i8vec";
        goto LAB_002fc466;
      case UByte:
        pcVar18 = "u8vec";
LAB_002fc466:
        join<char_const(&)[6],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)pcVar18,(char (*) [6])ts,
                   &switchD_002fc0d0::switchdataD_0039a060);
        return __return_storage_ptr__;
      case Short:
        pcVar18 = "i16vec";
        break;
      case UShort:
        pcVar18 = "u16vec";
        break;
      case Int:
        pcVar18 = "ivec";
        goto LAB_002fc4da;
      case UInt:
        pcVar18 = "uvec";
        goto LAB_002fc4da;
      case Int64:
        pcVar18 = "i64vec";
        break;
      case UInt64:
        pcVar18 = "u64vec";
        break;
      default:
        goto switchD_002fc077_default;
      case Half:
        pcVar18 = "f16vec";
        break;
      case Float:
        pcVar18 = "i64vec";
LAB_002fc544:
        join<char_const(&)[4],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)(pcVar18 + 3),(char (*) [4])ts,ts_1_01);
        return __return_storage_ptr__;
      case Double:
        pcVar18 = "dvec";
LAB_002fc4da:
        join<char_const(&)[5],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)pcVar18,(char (*) [5])ts,ts_1_01);
        return __return_storage_ptr__;
      }
LAB_002fc50f:
      join<char_const(&)[7],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar18,(char (*) [7])ts,ts_1_01);
      return __return_storage_ptr__;
    }
    break;
  case UInt:
    bVar5 = (this->options).es;
    uVar14 = 0x81;
    if (bVar5 != false) {
      uVar14 = 299;
    }
    if (uVar14 < (this->options).version) goto LAB_002fbf70;
    if (bVar5 == false) {
      scope_expr._M_dataplus._M_p = (pointer)&scope_expr.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&scope_expr,"GL_EXT_gpu_shader4","");
      require_extension_internal(this,&scope_expr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)scope_expr._M_dataplus._M_p != &scope_expr.field_2) {
        operator_delete(scope_expr._M_dataplus._M_p);
      }
      BVar8 = type->basetype;
      goto switchD_002fbadc_caseD_2;
    }
switchD_002fc077_caseD_7:
    pcVar18 = (this->backend).basic_int_type;
    goto LAB_002fbdcf;
  case Struct:
    if ((this->backend).explicit_struct_type != true) {
      (*(this->super_Compiler)._vptr_Compiler[6])
                (__return_storage_ptr__,this,(ulong)(type->super_IVariant).self.id,1);
      return __return_storage_ptr__;
    }
    ts_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (&scope_expr,this,(ulong)(type->super_IVariant).self.id);
    join<char_const(&)[8],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)0x3572d2,(char (*) [8])&scope_expr,ts_1_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)scope_expr._M_dataplus._M_p == &scope_expr.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002fc34d;
  case Image:
  case SampledImage:
    (*(this->super_Compiler)._vptr_Compiler[0x17])(__return_storage_ptr__,this,type,(ulong)id,0);
    return __return_storage_ptr__;
  case Sampler:
    cVar10 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->super_Compiler).comparison_ids._M_h,&id_local);
    pcVar19 = "samplerShadow";
    if (cVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      pcVar19 = "sampler";
    }
    pcVar18 = pcVar19 + 0xd;
    if (cVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      pcVar18 = pcVar19 + 7;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    goto LAB_002fbe87;
  case AccelerationStructure:
    bVar5 = this->ray_tracing_is_khr;
    pcVar19 = "accelerationStructureNV";
    if ((ulong)bVar5 != 0) {
      pcVar19 = "accelerationStructureEXT";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar18 = pcVar19 + (ulong)bVar5 + 0x17;
    goto LAB_002fbe87;
  case RayQuery:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar19 = "rayQueryEXT";
    pcVar18 = "";
    goto LAB_002fbe87;
  }
  switch(type->basetype) {
  case Boolean:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar19 = "bool";
    pcVar18 = "";
    break;
  case SByte:
    pcVar18 = (this->backend).basic_int8_type;
    goto LAB_002fbdcf;
  case UByte:
    pcVar18 = (this->backend).basic_uint8_type;
    goto LAB_002fbdcf;
  case Short:
    pcVar18 = (this->backend).basic_int16_type;
    goto LAB_002fbdcf;
  case UShort:
    pcVar18 = (this->backend).basic_uint16_type;
    goto LAB_002fbdcf;
  case Int:
    goto switchD_002fc077_caseD_7;
  case UInt:
    pcVar18 = (this->backend).basic_uint_type;
LAB_002fbdcf:
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar18,(allocator *)&scope_expr);
    return __return_storage_ptr__;
  case Int64:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar19 = "int64_t";
    pcVar18 = "";
    break;
  case UInt64:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar19 = "uint64_t";
    pcVar18 = "";
    break;
  case AtomicCounter:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar19 = "atomic_uint";
    pcVar18 = "";
    break;
  case Half:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar19 = "float16_t";
    pcVar18 = "";
    break;
  case Float:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar19 = "float";
    pcVar18 = "";
    break;
  case Double:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar19 = "double";
    pcVar18 = "";
    break;
  default:
    goto switchD_002fc077_default;
  }
LAB_002fbe87:
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar19,pcVar18);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	if (is_physical_pointer(type) && !is_physical_pointer_to_buffer_block(type))
	{
		// Need to create a magic type name which compacts the entire type information.
		auto *parent = &get_pointee_type(type);
		string name = type_to_glsl(*parent);

		uint32_t array_stride = get_decoration(type.parent_type, DecorationArrayStride);

		// Resolve all array dimensions in one go since once we lose the pointer type,
		// array information is left to to_array_type_glsl. The base type loses array information.
		while (is_array(*parent))
		{
			if (parent->array_size_literal.back())
				name += join(type.array.back(), "_");
			else
				name += join("id", type.array.back(), "_");

			name += "stride_" + std::to_string(array_stride);

			array_stride = get_decoration(parent->parent_type, DecorationArrayStride);
			parent = &get<SPIRType>(parent->parent_type);
		}

		name += "Pointer";
		return name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id);

	case SPIRType::Sampler:
		// The depth field is set by calling code based on the variable ID of the sampler, effectively reintroducing
		// this distinction into the type system.
		return comparison_ids.count(id) ? "samplerShadow" : "sampler";

	case SPIRType::AccelerationStructure:
		return ray_tracing_is_khr ? "accelerationStructureEXT" : "accelerationStructureNV";

	case SPIRType::RayQuery:
		return "rayQueryEXT";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.basetype == SPIRType::UInt && is_legacy())
	{
		if (options.es)
			// HACK: spirv-cross changes bools into uints and generates code which compares them to
			// zero. Input code will have already been validated as not to have contained any uints,
			// so any remaining uints must in fact be bools. However, simply returning "bool" here
			// will result in invalid code. Instead, return an int.
			return backend.basic_int_type;
		else
			require_extension_internal("GL_EXT_gpu_shader4");
	}

	if (type.basetype == SPIRType::AtomicCounter)
	{
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for atomic counters.");
		else if (!options.es && options.version < 420)
			require_extension_internal("GL_ARB_shader_atomic_counters");
	}

	const SPIRType *coop_type = &type;
	while (is_pointer(*coop_type) || is_array(*coop_type))
		coop_type = &get<SPIRType>(coop_type->parent_type);

	if (coop_type->op == spv::OpTypeCooperativeMatrixKHR)
	{
		require_extension_internal("GL_KHR_cooperative_matrix");
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cooperative matrix only available in Vulkan.");
		// GLSL doesn't support this as spec constant, which makes sense ...
		uint32_t use_type = get<SPIRConstant>(coop_type->cooperative.use_id).scalar();

		const char *use = nullptr;
		switch (use_type)
		{
		case CooperativeMatrixUseMatrixAKHR:
			use = "gl_MatrixUseA";
			break;

		case CooperativeMatrixUseMatrixBKHR:
			use = "gl_MatrixUseB";
			break;

		case CooperativeMatrixUseMatrixAccumulatorKHR:
			use = "gl_MatrixUseAccumulator";
			break;

		default:
			SPIRV_CROSS_THROW("Invalid matrix use.");
		}

		string scope_expr;
		if (const auto *scope = maybe_get<SPIRConstant>(coop_type->cooperative.scope_id))
		{
			if (!scope->specialization)
			{
				require_extension_internal("GL_KHR_memory_scope_semantics");
				if (scope->scalar() == spv::ScopeSubgroup)
					scope_expr = "gl_ScopeSubgroup";
				else if (scope->scalar() == spv::ScopeWorkgroup)
					scope_expr = "gl_ScopeWorkgroup";
				else
					SPIRV_CROSS_THROW("Invalid scope for cooperative matrix.");
			}
		}

		if (scope_expr.empty())
			scope_expr = to_expression(coop_type->cooperative.scope_id);

		return join("coopmat<", type_to_glsl(get<SPIRType>(coop_type->parent_type)), ", ",
		            scope_expr, ", ",
		            to_expression(coop_type->cooperative.rows_id), ", ",
		            to_expression(coop_type->cooperative.columns_id), ", ", use, ">");
	}

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::SByte:
			return backend.basic_int8_type;
		case SPIRType::UByte:
			return backend.basic_uint8_type;
		case SPIRType::Short:
			return backend.basic_int16_type;
		case SPIRType::UShort:
			return backend.basic_uint16_type;
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			return "float16_t";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			return "int64_t";
		case SPIRType::UInt64:
			return "uint64_t";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bvec", type.vecsize);
		case SPIRType::SByte:
			return join("i8vec", type.vecsize);
		case SPIRType::UByte:
			return join("u8vec", type.vecsize);
		case SPIRType::Short:
			return join("i16vec", type.vecsize);
		case SPIRType::UShort:
			return join("u16vec", type.vecsize);
		case SPIRType::Int:
			return join("ivec", type.vecsize);
		case SPIRType::UInt:
			return join("uvec", type.vecsize);
		case SPIRType::Half:
			return join("f16vec", type.vecsize);
		case SPIRType::Float:
			return join("vec", type.vecsize);
		case SPIRType::Double:
			return join("dvec", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else if (type.vecsize == type.columns) // Simple Matrix builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}